

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O2

REF_STATUS ref_split_edge_geometry(REF_GRID ref_grid)

{
  int *piVar1;
  uint node0;
  uint node1;
  REF_NODE pRVar2;
  REF_ADJ pRVar3;
  REF_INT *pRVar4;
  uint uVar5;
  undefined8 uVar6;
  char *pcVar7;
  long lVar8;
  REF_INT new_node;
  REF_BOOL allowed;
  REF_BOOL tri_side;
  REF_GLOB global;
  REF_EDGE ref_edge;
  REF_INT local_58;
  uint local_54;
  REF_NODE local_50;
  int local_44;
  REF_GLOB local_40;
  REF_EDGE local_38;
  
  pRVar2 = ref_grid->node;
  uVar5 = ref_edge_create(&local_38,ref_grid);
  if (uVar5 != 0) {
    pcVar7 = "orig edges";
    uVar6 = 0x3af;
LAB_001e0df4:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",uVar6,
           "ref_split_edge_geometry",(ulong)uVar5,pcVar7);
    return uVar5;
  }
  lVar8 = 0;
  local_50 = pRVar2;
LAB_001e0e1c:
  if (local_38->n <= lVar8) {
    ref_edge_free(local_38);
    return 0;
  }
  node0 = local_38->e2n[lVar8 * 2];
  node1 = local_38->e2n[lVar8 * 2 + 1];
  uVar5 = ref_cell_has_side(ref_grid->cell[8],node0,node1,(REF_BOOL *)&local_54);
  if (uVar5 != 0) {
    pcVar7 = "has side";
    uVar6 = 0x3b5;
    goto LAB_001e0df4;
  }
  if (local_54 != 0) {
    uVar5 = ref_split_edge_mixed(ref_grid,node0,node1,(REF_BOOL *)&local_54);
    if (uVar5 != 0) {
      pcVar7 = "mixed";
      uVar6 = 0x3b8;
      goto LAB_001e0df4;
    }
    if (local_54 != 0) {
      uVar5 = ref_cell_has_side(ref_grid->cell[3],node0,node1,&local_44);
      if (uVar5 != 0) {
        pcVar7 = "has side";
        uVar6 = 0x3bc;
        goto LAB_001e0df4;
      }
      if (-1 < (int)node0) {
        pRVar3 = ref_grid->cell[3]->ref_adj;
        uVar5 = pRVar3->nnode;
        if (((((int)node0 < (int)uVar5) && (node1 < uVar5)) && (-1 < (int)node1)) &&
           ((pRVar4 = pRVar3->first, pRVar4[node0] != -1 && (pRVar4[node1] != -1)))) {
          local_54 = (uint)(local_44 == 0);
          if (local_44 != 0) goto LAB_001e0fda;
          uVar5 = ref_cell_local_gem(ref_grid->cell[8],local_50,node0,node1,(REF_BOOL *)&local_54);
          if (uVar5 != 0) {
            pcVar7 = "local tet";
            uVar6 = 0x3c4;
            goto LAB_001e0df4;
          }
          if (local_54 == 0) {
            pRVar4 = local_50->age;
            piVar1 = pRVar4 + node0;
            *piVar1 = *piVar1 + 1;
            piVar1 = pRVar4 + node1;
            *piVar1 = *piVar1 + 1;
          }
          else {
            uVar5 = ref_node_next_global(local_50,&local_40);
            if (uVar5 != 0) {
              pcVar7 = "next global";
              uVar6 = 0x3cb;
              goto LAB_001e0df4;
            }
            uVar5 = ref_node_add(local_50,local_40,&local_58);
            if (uVar5 != 0) {
              pcVar7 = "new node";
              uVar6 = 0x3cc;
              goto LAB_001e0df4;
            }
            uVar5 = ref_node_interpolate_edge(local_50,node0,node1,0.5,local_58);
            if (uVar5 != 0) {
              pcVar7 = "interp new node";
              uVar6 = 0x3ce;
              goto LAB_001e0df4;
            }
            uVar5 = ref_geom_add_between(ref_grid,node0,node1,0.5,local_58);
            if (uVar5 != 0) {
              pcVar7 = "geom new node";
              uVar6 = 0x3d0;
              goto LAB_001e0df4;
            }
            uVar5 = ref_geom_constrain(ref_grid,local_58);
            if (uVar5 != 0) {
              pcVar7 = "geom constraint";
              uVar6 = 0x3d1;
              goto LAB_001e0df4;
            }
            uVar5 = ref_metric_interpolate_between(ref_grid,node0,node1,local_58);
            if (uVar5 != 0) {
              pcVar7 = "interp new node metric";
              uVar6 = 0x3d3;
              goto LAB_001e0df4;
            }
            uVar5 = ref_split_edge(ref_grid,node0,node1,local_58);
            if (uVar5 != 0) {
              pcVar7 = "split";
              uVar6 = 0x3d5;
              goto LAB_001e0df4;
            }
          }
          goto LAB_001e0fda;
        }
      }
      local_54 = 0;
    }
  }
LAB_001e0fda:
  lVar8 = lVar8 + 1;
  goto LAB_001e0e1c;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_geometry(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_INT edge;
  REF_BOOL allowed, tri_side;
  REF_GLOB global;
  REF_INT node0, node1;
  REF_INT new_node;

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_cell_has_side(ref_grid_tet(ref_grid), node0, node1, &allowed),
        "has side");
    if (!allowed) continue;

    RSS(ref_split_edge_mixed(ref_grid, node0, node1, &allowed), "mixed");
    if (!allowed) continue;

    RSS(ref_cell_has_side(ref_grid_tri(ref_grid), node0, node1, &tri_side),
        "has side");
    allowed =
        (!ref_cell_node_empty(ref_grid_tri(ref_grid), node0) &&
         !ref_cell_node_empty(ref_grid_tri(ref_grid), node1) && !tri_side);
    if (!allowed) continue;

    RSS(ref_cell_local_gem(ref_grid_tet(ref_grid), ref_node, node0, node1,
                           &allowed),
        "local tet");
    if (!allowed) {
      ref_node_age(ref_node, node0)++;
      ref_node_age(ref_node, node1)++;
      continue;
    }

    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &new_node), "new node");
    RSS(ref_node_interpolate_edge(ref_node, node0, node1, 0.5, new_node),
        "interp new node");
    RSS(ref_geom_add_between(ref_grid, node0, node1, 0.5, new_node),
        "geom new node");
    RSS(ref_geom_constrain(ref_grid, new_node), "geom constraint");
    RSS(ref_metric_interpolate_between(ref_grid, node0, node1, new_node),
        "interp new node metric");

    RSS(ref_split_edge(ref_grid, node0, node1, new_node), "split");
  }

  ref_edge_free(ref_edge);

  return REF_SUCCESS;
}